

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

int rtosc_count_printed_arg_vals(char *src)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  char *pcVar6;
  bool bVar7;
  int skipped_now;
  int local_3c;
  int local_38;
  int local_34;
  
  cVar1 = *src;
  while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 != 0))) {
    cVar1 = src[1];
    src = src + 1;
  }
  if (*src == '%') {
    pcVar6 = src;
    do {
      local_38 = 0;
      __isoc99_sscanf(pcVar6,"%*[^\n] %n",&local_38);
      src = pcVar6 + local_38;
      pcVar4 = pcVar6 + local_38;
      pcVar6 = src;
    } while (*pcVar4 == '%');
  }
  local_3c = 0;
  bVar7 = false;
  iVar2 = 0;
  pcVar6 = (char *)0x0;
  do {
    if ((*src == '\0') || (*src == '/')) break;
    pcVar4 = rtosc_skip_next_printed_arg(src,&local_3c,(char *)0x0,pcVar6,1,0);
    if (pcVar4 != (char *)0x0) {
      cVar1 = *pcVar4;
      while ((cVar1 != '\0' && (iVar3 = isspace((int)cVar1), iVar3 != 0))) {
        cVar1 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      }
      cVar1 = *pcVar4;
      if (((long)cVar1 != 0) &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0))
      {
        cVar1 = *pcVar4;
        while (cVar1 == '%') {
          local_34 = 0;
          __isoc99_sscanf(pcVar4,"%*[^\n] %n",&local_34);
          cVar1 = pcVar4[local_34];
          pcVar4 = pcVar4 + local_34;
        }
      }
    }
    iVar2 = iVar2 + local_3c;
    bVar7 = pcVar4 == (char *)0x0;
    pcVar6 = src;
    src = pcVar4;
  } while (!bVar7);
  iVar3 = -iVar2;
  if (!bVar7) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

int rtosc_count_printed_arg_vals(const char* src)
{
    int num = 0;

    skip_while(&src, isspace);
    while (*src == '%')
        skip_fmt(&src, "%*[^\n] %n");

    int skipped_now = 0;
    const char* recent_src = NULL;
    for(; src && *src && *src != '/'; num += skipped_now)
    {
        const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped_now,
                                                         NULL, recent_src, 1,
                                                         0);
        recent_src = src;
        src = newsrc;

        if(src) // no parse error
        {
            skip_while(&src, isspace);
            if(*src && !isspace(*src))
            {
                while (*src == '%')
                    skip_fmt(&src, "%*[^\n] %n");
            }
        }
    }
    return src ? num : -num;
}